

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 152.test.cpp
# Opt level: O1

void verifyChunkWithOneDilution(Type<2,_152> *chunk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  member_size_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
  n;
  ulong uVar10;
  long lVar11;
  pointer pdVar12;
  pointer pdVar13;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_358;
  undefined1 local_310 [8];
  undefined8 local_308;
  char *local_300;
  undefined1 local_2f8 [8];
  int local_2f0;
  undefined4 uStack_2ec;
  double *local_2e8;
  int local_2e0;
  char local_2dc;
  undefined4 local_2d8;
  char local_2d4;
  undefined1 local_2d0 [8];
  undefined8 local_2c8;
  ITransientExpression *local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [2];
  ITransientExpression local_298;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
  *local_288;
  WithinRelMatcher *local_280;
  int *local_278;
  undefined4 *local_270;
  pointer local_268;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_260;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_258;
  pointer local_250;
  int *local_248;
  undefined4 *local_240;
  pointer local_238;
  undefined8 local_230;
  double local_228;
  pointer local_220;
  int *local_218;
  undefined4 *local_210;
  undefined8 local_208;
  undefined1 local_200 [9];
  bool local_1f7;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_1f0;
  WithinRelMatcher *local_1e8;
  iterator_t<CRng> local_1e0;
  undefined1 *local_1d8;
  iterator_t<CRng> local_1d0;
  undefined1 *local_1c8;
  iterator_t<CRng> local_1c0;
  undefined1 *local_1b8;
  iterator_t<CRng> local_1b0;
  undefined1 *local_1a8;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
  local_1a0;
  pointer local_180;
  undefined8 local_178;
  double local_170;
  pointer local_168;
  int *local_160;
  undefined4 *local_158;
  pointer local_150;
  undefined8 local_148;
  double local_140;
  pointer local_138;
  int *local_130;
  undefined4 *local_128;
  pointer local_120;
  undefined8 local_118;
  double local_110;
  pointer local_108;
  int *local_100;
  undefined4 *local_f8;
  pointer local_f0;
  undefined8 local_e8;
  double local_e0;
  pointer local_d8;
  int *local_d0;
  undefined4 *local_c8;
  pointer local_c0;
  undefined8 local_b8;
  double local_b0;
  pointer local_a8;
  int *local_a0;
  undefined4 *local_98;
  pointer local_90;
  undefined8 local_88;
  double local_80;
  pointer local_78;
  int *local_70;
  undefined4 *local_68;
  pointer local_60;
  undefined8 local_58;
  double local_50;
  pointer local_48;
  int *local_40;
  undefined4 *local_38;
  
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xef;
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "152 == chunk.MT()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName,(SourceLineInfo *)local_310,capturedExpression,ContinueOnFailure);
  local_308._0_2_ = 0x101;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 0x98;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = 0x98;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf0;
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "152 == chunk.sectionNumber()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_00,(SourceLineInfo *)local_310,capturedExpression_00,
             ContinueOnFailure);
  local_308._0_2_ = 0x101;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 0x98;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = 0x98;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf2;
  capturedExpression_01.m_size = 0x13;
  capturedExpression_01.m_start = "94239 == chunk.ZA()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_01,(SourceLineInfo *)local_310,capturedExpression_01,
             ContinueOnFailure);
  iVar6 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).ZA_;
  local_308._1_1_ = iVar6 == 0x1701f;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 0x1701f;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf3;
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "94239 == chunk.targetIdentifier()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_02,(SourceLineInfo *)local_310,capturedExpression_02,
             ContinueOnFailure);
  iVar6 = (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).ZA_;
  local_308._1_1_ = iVar6 == 0x1701f;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 0x1701f;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf4;
  capturedExpression_03.m_size = 0x25;
  capturedExpression_03.m_start = "2.369986e+2, WithinRel( chunk.AWR() )";
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_03,(SourceLineInfo *)local_310,capturedExpression_03,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x406d9ff487fcb924;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).atomicWeightRatio_);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf5;
  capturedExpression_04.m_size = 0x33;
  capturedExpression_04.m_start = "2.369986e+2, WithinRel( chunk.atomicWeightRatio() )";
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_04,(SourceLineInfo *)local_310,capturedExpression_04,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x406d9ff487fcb924;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->super_BaseWithoutMT<njoy::ENDFtk::section::Type<2,_152>_>).atomicWeightRatio_);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf7;
  capturedExpression_05.m_size = 0x11;
  capturedExpression_05.m_start = "1 == chunk.LSSF()";
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_05,(SourceLineInfo *)local_310,capturedExpression_05,
             ContinueOnFailure);
  local_308._1_1_ = chunk->lssf_;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db238;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0._0_1_ = chunk->lssf_;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf8;
  capturedExpression_06.m_size = 0x1e;
  capturedExpression_06.m_start = "1 == chunk.selfShieldingOnly()";
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_06,(SourceLineInfo *)local_310,capturedExpression_06,
             ContinueOnFailure);
  local_308._1_1_ = chunk->lssf_;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db238;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0._0_1_ = chunk->lssf_;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xf9;
  capturedExpression_07.m_size = 0x1a;
  capturedExpression_07.m_start = "2 == chunk.interpolation()";
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_07,(SourceLineInfo *)local_310,capturedExpression_07,
             ContinueOnFailure);
  local_308._1_1_ = chunk->interpolation_ == 2;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 2;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = chunk->interpolation_;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xfb;
  capturedExpression_08.m_size = 0x10;
  capturedExpression_08.m_start = "19 == chunk.NW()";
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_08,(SourceLineInfo *)local_310,capturedExpression_08,
             ContinueOnFailure);
  iVar6 = (int)((ulong)((long)(chunk->data_).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_308._1_1_ = iVar6 == 0x13;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 0x13;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xfc;
  capturedExpression_09.m_size = 0x1a;
  capturedExpression_09.m_start = "19 == chunk.numberValues()";
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_09,(SourceLineInfo *)local_310,capturedExpression_09,
             ContinueOnFailure);
  iVar6 = (int)((ulong)((long)(chunk->data_).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_308._1_1_ = iVar6 == 0x13;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 0x13;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xfe;
  capturedExpression_10.m_size = 0x12;
  capturedExpression_10.m_start = "5 == chunk.NREAC()";
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_10,(SourceLineInfo *)local_310,capturedExpression_10,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_308._1_1_ = iVar6 == 5;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 5;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0xff;
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "5 == chunk.numberReactions()";
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_11,(SourceLineInfo *)local_310,capturedExpression_11,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_308._1_1_ = iVar6 == 5;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 5;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x100;
  capturedExpression_12.m_size = 0x12;
  capturedExpression_12.m_start = "1 == chunk.NSIGZ()";
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_12,(SourceLineInfo *)local_310,capturedExpression_12,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_308._1_1_ = iVar6 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x101;
  capturedExpression_13.m_size = 0x1c;
  capturedExpression_13.m_start = "1 == chunk.numberDilutions()";
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_13,(SourceLineInfo *)local_310,capturedExpression_13,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_308._1_1_ = iVar6 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x102;
  capturedExpression_14.m_size = 0x11;
  capturedExpression_14.m_start = "3 == chunk.NUNR()";
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_14,(SourceLineInfo *)local_310,capturedExpression_14,
             ContinueOnFailure);
  iVar6 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_308._1_1_ = iVar6 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x103;
  capturedExpression_15.m_size = 0x1b;
  capturedExpression_15.m_start = "3 == chunk.numberEnergies()";
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_15,(SourceLineInfo *)local_310,capturedExpression_15,
             ContinueOnFailure);
  iVar6 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>;
  local_308._1_1_ = iVar6 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1b8;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  local_2f0 = iVar6;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x105;
  capturedExpression_16.m_size = 0x1d;
  capturedExpression_16.m_start = "0., WithinRel( chunk.TEMZ() )";
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_16,(SourceLineInfo *)local_310,capturedExpression_16,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->data_).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x106;
  capturedExpression_17.m_size = 0x24;
  capturedExpression_17.m_start = "0., WithinRel( chunk.temperature() )";
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_17,(SourceLineInfo *)local_310,capturedExpression_17,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->data_).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x108;
  capturedExpression_18.m_size = 0x18;
  capturedExpression_18.m_start = "1 == chunk.SIGZ().size()";
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_18,(SourceLineInfo *)local_310,capturedExpression_18,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_308._1_1_ = (uVar7 & 0xffffffff) == 1;
  local_308._0_1_ = true;
  _local_2f0 = SEXT48((int)uVar7);
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x109;
  capturedExpression_19.m_size = 0x1d;
  capturedExpression_19.m_start = "1 == chunk.dilutions().size()";
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_19,(SourceLineInfo *)local_310,capturedExpression_19,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  _local_2f0 = SEXT48((int)uVar7);
  local_308._1_1_ = (uVar7 & 0xffffffff) == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x10a;
  capturedExpression_20.m_size = 0x23;
  capturedExpression_20.m_start = "1e+10, WithinRel( chunk.SIGZ()[0] )";
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_20,(SourceLineInfo *)local_310,capturedExpression_20,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x4202a05f20000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x10b;
  capturedExpression_21.m_size = 0x28;
  capturedExpression_21.m_start = "1e+10, WithinRel( chunk.dilutions()[0] )";
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_21,(SourceLineInfo *)local_310,capturedExpression_21,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x4202a05f20000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x10d;
  capturedExpression_22.m_size = 0x18;
  capturedExpression_22.m_start = "3 == chunk.EUNR().size()";
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_22,(SourceLineInfo *)local_310,capturedExpression_22,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uVar7 = (ulong)(iVar6 * 5 + 1);
  _local_2f0 = ((uVar7 + ((long)(chunk->data_).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)((chunk->data_).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + iVar6) >> 3)) - 1) / uVar7;
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x10e;
  capturedExpression_23.m_size = 0x1c;
  capturedExpression_23.m_start = "3 == chunk.energies().size()";
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_23,(SourceLineInfo *)local_310,capturedExpression_23,
             ContinueOnFailure);
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uVar7 = (ulong)(iVar6 * 5 + 1);
  _local_2f0 = ((uVar7 + ((long)(chunk->data_).data.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)((chunk->data_).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + iVar6) >> 3)) - 1) / uVar7;
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x10f;
  capturedExpression_24.m_size = 0x23;
  capturedExpression_24.m_start = "2500., WithinRel( chunk.EUNR()[0] )";
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_24,(SourceLineInfo *)local_310,capturedExpression_24,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x40a3880000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [(int)(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x110;
  capturedExpression_25.m_size = 0x23;
  capturedExpression_25.m_start = "2550., WithinRel( chunk.EUNR()[1] )";
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_25,(SourceLineInfo *)local_310,capturedExpression_25,
             ContinueOnFailure);
  local_268 = (pointer)0x40a3ec0000000000;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_2c0 = (ITransientExpression *)
              ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6);
  local_2c8 = (pointer)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  local_2b8[0]._0_8_ = ZEXT48(iVar6 * 5 + 1);
  auVar1._8_8_ = (long)local_2c8 - (long)local_2c0 >> 0x3f;
  auVar1._0_8_ = (long)local_2c8 - (long)local_2c0 >> 3;
  lVar11 = SUB168(auVar1 % SEXT816((long)local_2b8[0]._0_8_),0);
  local_2b8[0]._8_8_ = local_2b8[0]._0_8_ - lVar11;
  if (lVar11 == 0) {
    local_2b8[0]._8_8_ = 0;
  }
  local_1e0._M_current = (double *)local_2c0;
  local_1d8 = local_2d0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1d8,&local_1e0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,*local_1e0._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_268);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_268;
  local_280 = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x111;
  capturedExpression_26.m_size = 0x24;
  capturedExpression_26.m_start = "30000., WithinRel( chunk.EUNR()[2] )";
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_26,(SourceLineInfo *)local_310,capturedExpression_26,
             ContinueOnFailure);
  local_268 = (pointer)0x40dd4c0000000000;
  local_2c8 = (pointer)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_2c0 = (ITransientExpression *)
              ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6);
  local_2b8[0]._0_8_ = ZEXT48(iVar6 * 5 + 1);
  auVar2._8_8_ = (long)local_2c8 - (long)local_2c0 >> 0x3f;
  auVar2._0_8_ = (long)local_2c8 - (long)local_2c0 >> 3;
  lVar11 = SUB168(auVar2 % SEXT816((long)local_2b8[0]._0_8_),0);
  local_2b8[0]._8_8_ = local_2b8[0]._0_8_ - lVar11;
  if (lVar11 == 0) {
    local_2b8[0]._8_8_ = 0;
  }
  local_1d0._M_current = (double *)local_2c0;
  local_1c8 = local_2d0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1c8,&local_1d0,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,*local_1d0._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_268);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_268;
  local_280 = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x112;
  capturedExpression_27.m_size = 0x27;
  capturedExpression_27.m_start = "2500., WithinRel( chunk.energies()[0] )";
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_27,(SourceLineInfo *)local_310,capturedExpression_27,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x40a3880000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [(int)(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x113;
  capturedExpression_28.m_size = 0x27;
  capturedExpression_28.m_start = "2550., WithinRel( chunk.energies()[1] )";
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_28,(SourceLineInfo *)local_310,capturedExpression_28,
             ContinueOnFailure);
  local_268 = (pointer)0x40a3ec0000000000;
  local_2c8 = (pointer)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_2c0 = (ITransientExpression *)
              ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6);
  local_2b8[0]._0_8_ = ZEXT48(iVar6 * 5 + 1);
  auVar3._8_8_ = (long)local_2c8 - (long)local_2c0 >> 0x3f;
  auVar3._0_8_ = (long)local_2c8 - (long)local_2c0 >> 3;
  lVar11 = SUB168(auVar3 % SEXT816((long)local_2b8[0]._0_8_),0);
  local_2b8[0]._8_8_ = local_2b8[0]._0_8_ - lVar11;
  if (lVar11 == 0) {
    local_2b8[0]._8_8_ = 0;
  }
  local_1c0._M_current = (double *)local_2c0;
  local_1b8 = local_2d0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1b8,&local_1c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,*local_1c0._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_268);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_268;
  local_280 = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x114;
  capturedExpression_29.m_size = 0x28;
  capturedExpression_29.m_start = "30000., WithinRel( chunk.energies()[2] )";
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_29,(SourceLineInfo *)local_310,capturedExpression_29,
             ContinueOnFailure);
  local_268 = (pointer)0x40dd4c0000000000;
  local_2c8 = (pointer)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
  iVar6 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_2c0 = (ITransientExpression *)
              ((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6);
  local_2b8[0]._0_8_ = ZEXT48(iVar6 * 5 + 1);
  auVar4._8_8_ = (long)local_2c8 - (long)local_2c0 >> 0x3f;
  auVar4._0_8_ = (long)local_2c8 - (long)local_2c0 >> 3;
  lVar11 = SUB168(auVar4 % SEXT816((long)local_2b8[0]._0_8_),0);
  local_2b8[0]._8_8_ = local_2b8[0]._0_8_ - lVar11;
  if (lVar11 == 0) {
    local_2b8[0]._8_8_ = 0;
  }
  local_1b0._M_current = (double *)local_2c0;
  local_1a8 = local_2d0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1a8,&local_1b0,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,*local_1b0._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_268);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_268;
  local_280 = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x116;
  capturedExpression_30.m_size = 0x19;
  capturedExpression_30.m_start = "3 == chunk.total().size()";
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_30,(SourceLineInfo *)local_310,capturedExpression_30,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar9 = (int)uVar7 *
          (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_2f0 = (uVar7 / uVar9 + 1) - (ulong)(uVar7 % (ulong)uVar9 == 0);
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x117;
  capturedExpression_31.m_size = 0x1b;
  capturedExpression_31.m_start = "3 == chunk.elastic().size()";
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_31,(SourceLineInfo *)local_310,capturedExpression_31,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar9 = (int)uVar7 *
          (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_2f0 = (uVar7 / uVar9 + 1) - (ulong)(uVar7 % (ulong)uVar9 == 0);
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x118;
  capturedExpression_32.m_size = 0x1b;
  capturedExpression_32.m_start = "3 == chunk.fission().size()";
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_32,(SourceLineInfo *)local_310,capturedExpression_32,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar9 = (int)uVar7 *
          (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_2f0 = (uVar7 / uVar9 + 1) - (ulong)(uVar7 % (ulong)uVar9 == 0);
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x119;
  capturedExpression_33.m_size = 0x1b;
  capturedExpression_33.m_start = "3 == chunk.capture().size()";
  macroName_33.m_size = 5;
  macroName_33.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_33,(SourceLineInfo *)local_310,capturedExpression_33,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar9 = (int)uVar7 *
          (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_2f0 = (uVar7 / uVar9 + 1) - (ulong)(uVar7 % (ulong)uVar9 == 0);
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x11a;
  capturedExpression_34.m_size = 0x28;
  capturedExpression_34.m_start = "3 == chunk.currentWeightedTotal().size()";
  macroName_34.m_size = 5;
  macroName_34.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_34,(SourceLineInfo *)local_310,capturedExpression_34,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar9 = (int)uVar7 *
          (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl + 1;
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar7 & 0xffffffff)) >> 3;
  _local_2f0 = (uVar7 / uVar9 + 1) - (ulong)(uVar7 % (ulong)uVar9 == 0);
  local_308._1_1_ = _local_2f0 == 3;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 3;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x11b;
  capturedExpression_35.m_size = 0x1c;
  capturedExpression_35.m_start = "1 == chunk.total()[0].size()";
  macroName_35.m_size = 5;
  macroName_35.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_35,(SourceLineInfo *)local_310,capturedExpression_35,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = uVar7 & 0xffffffff;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)((chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar10) >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  _local_2f0 = (long)(uVar7 * 8 + -8) >> 3;
  if (uVar10 < (ulong)_local_2f0) {
    _local_2f0 = uVar10;
  }
  local_308._1_1_ = _local_2f0 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x11c;
  capturedExpression_36.m_size = 0x1e;
  capturedExpression_36.m_start = "1 == chunk.elastic()[0].size()";
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_36,(SourceLineInfo *)local_310,capturedExpression_36,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar10 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar10 < uVar7) {
    uVar7 = uVar10;
  }
  pdVar12 = pdVar13 + uVar8 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8) {
    pdVar12 = pdVar13 + uVar7;
  }
  _local_2f0 = (long)(pdVar13 + uVar7) - (long)pdVar12 >> 3;
  if (uVar8 < (ulong)_local_2f0) {
    _local_2f0 = uVar8;
  }
  local_308._1_1_ = _local_2f0 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x11d;
  capturedExpression_37.m_size = 0x1e;
  capturedExpression_37.m_start = "1 == chunk.fission()[0].size()";
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_37,(SourceLineInfo *)local_310,capturedExpression_37,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar10 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar10 < uVar7) {
    uVar7 = uVar10;
  }
  pdVar12 = pdVar13 + uVar8 * 2 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8 * 2) {
    pdVar12 = pdVar13 + uVar7;
  }
  _local_2f0 = (long)(pdVar13 + uVar7) - (long)pdVar12 >> 3;
  if (uVar8 < (ulong)_local_2f0) {
    _local_2f0 = uVar8;
  }
  local_308._1_1_ = _local_2f0 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x11e;
  capturedExpression_38.m_size = 0x1e;
  capturedExpression_38.m_start = "1 == chunk.capture()[0].size()";
  macroName_38.m_size = 5;
  macroName_38.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_38,(SourceLineInfo *)local_310,capturedExpression_38,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar10 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar10 < uVar7) {
    uVar7 = uVar10;
  }
  pdVar12 = pdVar13 + uVar8 * 3 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8 * 3) {
    pdVar12 = pdVar13 + uVar7;
  }
  _local_2f0 = (long)(pdVar13 + uVar7) - (long)pdVar12 >> 3;
  if (uVar8 < (ulong)_local_2f0) {
    _local_2f0 = uVar8;
  }
  local_308._1_1_ = _local_2f0 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x11f;
  capturedExpression_39.m_size = 0x2b;
  capturedExpression_39.m_start = "1 == chunk.currentWeightedTotal()[0].size()";
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_39,(SourceLineInfo *)local_310,capturedExpression_39,
             ContinueOnFailure);
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar8 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar8;
  uVar10 = (ulong)((int)uVar7 *
                   (int)(chunk->data_).metadata.fields.
                        super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                        super__Tuple_impl<2UL,_long,_long,_long,_long>.
                        super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar10 < uVar7) {
    uVar7 = uVar10;
  }
  pdVar12 = pdVar13 + uVar8 * 4 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar8 * 4) {
    pdVar12 = pdVar13 + uVar7;
  }
  _local_2f0 = (long)(pdVar13 + uVar7) - (long)pdVar12 >> 3;
  if (uVar8 < (ulong)_local_2f0) {
    _local_2f0 = uVar8;
  }
  local_308._1_1_ = _local_2f0 == 1;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db278;
  local_308._4_4_ = 1;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x120;
  capturedExpression_40.m_size = 0x2d;
  capturedExpression_40.m_start = "2.009120e+1, WithinRel( chunk.total()[0][0] )";
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_40,(SourceLineInfo *)local_310,capturedExpression_40,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x40341758e219652c;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_310,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [(ulong)(uint)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Tuple_impl<3UL,_long,_long,_long>.
                           super__Head_base<3UL,_long,_false>._M_head_impl + 1]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x121;
  capturedExpression_41.m_size = 0x2d;
  capturedExpression_41.m_start = "1.923568e+1, WithinRel( chunk.total()[1][0] )";
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_41,(SourceLineInfo *)local_310,capturedExpression_41,
             ContinueOnFailure);
  local_238 = (pointer)0x40333c558644523f;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 0;
  local_2d4 = '\x01';
  local_178 = 0;
  local_180 = (pointer)_local_2f0;
  local_170 = (double)local_2e8;
  local_168 = (pointer)local_2f8;
  local_160 = &local_2e0;
  local_158 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_180,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x122;
  capturedExpression_42.m_size = 0x2d;
  capturedExpression_42.m_start = "1.366039e+1, WithinRel( chunk.total()[2][0] )";
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_42,(SourceLineInfo *)local_310,capturedExpression_42,
             ContinueOnFailure);
  local_238 = (pointer)0x402b521ea35935fc;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 0;
  local_2d4 = '\x01';
  local_148 = 0;
  local_150 = (pointer)_local_2f0;
  local_140 = (double)local_2e8;
  local_138 = (pointer)local_2f8;
  local_130 = &local_2e0;
  local_128 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_150,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x123;
  capturedExpression_43.m_size = 0x2f;
  capturedExpression_43.m_start = "1.343187e+1, WithinRel( chunk.elastic()[0][0] )";
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_43,(SourceLineInfo *)local_310,capturedExpression_43,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x402add1e108c3f3e;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar10;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  uVar8 = uVar10 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar10) {
    uVar8 = uVar7;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,pdVar13[uVar8]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x124;
  capturedExpression_44.m_size = 0x2f;
  capturedExpression_44.m_start = "1.375705e+1, WithinRel( chunk.elastic()[1][0] )";
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_44,(SourceLineInfo *)local_310,capturedExpression_44,
             ContinueOnFailure);
  local_238 = (pointer)0x402b839c0ebedfa4;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 1;
  local_2d4 = '\x01';
  local_118 = 0;
  local_120 = (pointer)_local_2f0;
  local_110 = (double)local_2e8;
  local_108 = (pointer)local_2f8;
  local_100 = &local_2e0;
  local_f8 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_120,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x125;
  capturedExpression_45.m_size = 0x2f;
  capturedExpression_45.m_start = "1.156033e+1, WithinRel( chunk.elastic()[2][0] )";
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_45,(SourceLineInfo *)local_310,capturedExpression_45,
             ContinueOnFailure);
  local_238 = (pointer)0x40271ee392e1ef74;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 1;
  local_2d4 = '\x01';
  local_e8 = 0;
  local_f0 = (pointer)_local_2f0;
  local_e0 = (double)local_2e8;
  local_d8 = (pointer)local_2f8;
  local_d0 = &local_2e0;
  local_c8 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_f0,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x126;
  capturedExpression_46.m_size = 0x2f;
  capturedExpression_46.m_start = "4.234708e+0, WithinRel( chunk.fission()[0][0] )";
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_46,(SourceLineInfo *)local_310,capturedExpression_46,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x4010f0574b407033;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar10;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  lVar11 = uVar10 * 0x10 + 8;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar10 * 2) {
    lVar11 = uVar7 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,*(double *)(lVar11 + (long)pdVar13));
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x127;
  capturedExpression_47.m_size = 0x2f;
  capturedExpression_47.m_start = "2.725074e+0, WithinRel( chunk.fission()[1][0] )";
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_47,(SourceLineInfo *)local_310,capturedExpression_47,
             ContinueOnFailure);
  local_238 = (pointer)0x4005ccf398e97072;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 2;
  local_2d4 = '\x01';
  local_b8 = 0;
  local_c0 = (pointer)_local_2f0;
  local_b0 = (double)local_2e8;
  local_a8 = (pointer)local_2f8;
  local_a0 = &local_2e0;
  local_98 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x128;
  capturedExpression_48.m_size = 0x2f;
  capturedExpression_48.m_start = "1.572008e+0, WithinRel( chunk.fission()[2][0] )";
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_48,(SourceLineInfo *)local_310,capturedExpression_48,
             ContinueOnFailure);
  local_238 = (pointer)0x3ff926f1dc50ce4f;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 2;
  local_2d4 = '\x01';
  local_88 = 0;
  local_90 = (pointer)_local_2f0;
  local_80 = (double)local_2e8;
  local_78 = (pointer)local_2f8;
  local_70 = &local_2e0;
  local_68 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_90,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x129;
  capturedExpression_49.m_size = 0x2f;
  capturedExpression_49.m_start = "2.424629e+0, WithinRel( chunk.capture()[0][0] )";
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_49,(SourceLineInfo *)local_310,capturedExpression_49,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x400365a3e39f7729;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar10;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  uVar8 = uVar10 * 3 + 1;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar10 * 3) {
    uVar8 = uVar7;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,pdVar13[uVar8]);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x12a;
  capturedExpression_50.m_size = 0x2f;
  capturedExpression_50.m_start = "2.753559e+0, WithinRel( chunk.capture()[1][0] )";
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_50,(SourceLineInfo *)local_310,capturedExpression_50,
             ContinueOnFailure);
  local_238 = (pointer)0x40060749f0e4da0a;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 3;
  local_2d4 = '\x01';
  local_58 = 0;
  local_60 = (pointer)_local_2f0;
  local_50 = (double)local_2e8;
  local_48 = (pointer)local_2f8;
  local_40 = &local_2e0;
  local_38 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_60,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_238);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)&local_238;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x12b;
  capturedExpression_51.m_size = 0x2f;
  capturedExpression_51.m_start = "5.280525e-1, WithinRel( chunk.capture()[2][0] )";
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_51,(SourceLineInfo *)local_310,capturedExpression_51,
             ContinueOnFailure);
  local_200._0_8_ = (_func_int **)0x3fe0e5ce5b4245f6;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 3;
  local_2d4 = '\x01';
  local_230 = 0;
  local_238 = (pointer)_local_2f0;
  local_228 = (double)local_2e8;
  local_220 = (pointer)local_2f8;
  local_218 = &local_2e0;
  local_210 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,&local_238,2);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_258._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)local_200);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)local_200;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x12c;
  capturedExpression_52.m_size = 0x3c;
  capturedExpression_52.m_start = "2.009120e+1, WithinRel( chunk.currentWeightedTotal()[0][0] )";
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_52,(SourceLineInfo *)local_310,capturedExpression_52,
             ContinueOnFailure);
  local_298._vptr_ITransientExpression = (_func_int **)0x40341758e219652c;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  uVar10 = uVar7 & 0xffffffff;
  pdVar13 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + uVar10;
  uVar8 = (ulong)((int)uVar7 *
                  (int)(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Head_base<2UL,_long,_false>._M_head_impl + 1);
  uVar7 = (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar13 >> 3;
  if (uVar8 < uVar7) {
    uVar7 = uVar8;
  }
  lVar11 = uVar10 * 0x20 + 8;
  if ((ulong)((long)(uVar7 * 8 + -8) >> 3) <= uVar10 * 4) {
    lVar11 = uVar7 * 8;
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_310,*(double *)(lVar11 + (long)pdVar13));
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_310,(double *)&local_298);
  local_2c8._1_1_ = bVar5;
  local_2c8._0_1_ = true;
  local_2d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001db1f8;
  local_2c0 = &local_298;
  local_2b8[0]._0_8_ = (WithinRelMatcher *)local_310;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_2d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_2d0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x12d;
  capturedExpression_53.m_size = 0x3c;
  capturedExpression_53.m_start = "1.923568e+1, WithinRel( chunk.currentWeightedTotal()[1][0] )";
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_53,(SourceLineInfo *)local_310,capturedExpression_53,
             ContinueOnFailure);
  local_1a0._0_8_ = 0x40333c558644523f;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8._0_4_ =
       (int)(chunk->data_).metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl * local_2e0 + 1;
  local_2e8._4_4_ = 0;
  local_2dc = '\x01';
  local_2d8 = 4;
  local_2d4 = '\x01';
  local_260._M_current = (double *)0x0;
  local_268 = (pointer)_local_2f0;
  local_258._M_current = local_2e8;
  local_250 = (pointer)local_2f8;
  local_248 = &local_2e0;
  local_240 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)local_200,
             (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
              *)&local_268,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_2d0,*local_1f0._M_current);
  bVar5 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_2d0,(double *)&local_1a0);
  local_298.m_result = bVar5;
  local_298.m_isBinaryExpression = true;
  local_298._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001db1f8;
  local_288 = &local_1a0;
  local_280 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,&local_298);
  Catch::ITransientExpression::~ITransientExpression(&local_298);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x12e;
  capturedExpression_54.m_size = 0x3c;
  capturedExpression_54.m_start = "1.366039e+1, WithinRel( chunk.currentWeightedTotal()[2][0] )";
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_54,(SourceLineInfo *)local_310,capturedExpression_54,
             ContinueOnFailure);
  local_208 = 0x402b521ea35935fc;
  uVar7 = (chunk->data_).metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
          super__Head_base<3UL,_long,_false>._M_head_impl;
  local_2f8 = (undefined1  [8])
              (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2e0 = (int)uVar7;
  _local_2f0 = (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + (uVar7 & 0xffffffff);
  local_2e8 = (double *)
              (ulong)((int)(chunk->data_).metadata.fields.
                           super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                           super__Tuple_impl<2UL,_long,_long,_long,_long>.
                           super__Head_base<2UL,_long,_false>._M_head_impl * local_2e0 + 1);
  local_2dc = '\x01';
  local_2d8 = 4;
  local_2d4 = '\x01';
  local_298.m_isBinaryExpression = false;
  local_298.m_result = false;
  local_298._10_6_ = 0;
  local_298._vptr_ITransientExpression = (_func_int **)_local_2f0;
  local_288 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
               *)local_2e8;
  local_280 = (WithinRelMatcher *)local_2f8;
  local_278 = &local_2e0;
  local_270 = &local_2d8;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>>::adaptor<false>>>,ranges::iter_transform_view<ranges::transform_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>,njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#1}>,ranges::indirected<njoy::ENDFtk::section::Type<2,152>::reaction(unsigned_int)const::{lambda(auto:1_const&)#2}>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>(&local_1a0,&local_298,2);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_2d0,
             *(double *)
              local_1a0.base_.data_.
              super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>_>
              .
              super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
              ._M_head_impl._M_current);
  local_1f7 = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_2d0,(double *)&local_208);
  local_200[8] = true;
  local_200._0_8_ = &PTR_streamReconstructedExpression_001db1f8;
  local_1f0._M_current = (double *)&local_208;
  local_1e8 = (WithinRelMatcher *)local_2d0;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_200);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_200);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_2d0);
  if (local_2d4 == '\x01') {
    local_2d4 = '\0';
  }
  if (local_2dc == '\x01') {
    local_2dc = '\0';
  }
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_310 = (undefined1  [8])0x19c484;
  local_308 = (pointer)0x130;
  capturedExpression_55.m_size = 0xf;
  capturedExpression_55.m_start = "6 == chunk.NC()";
  macroName_55.m_size = 5;
  macroName_55.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_358,macroName_55,(SourceLineInfo *)local_310,capturedExpression_55,
             ContinueOnFailure);
  _local_2f0 = (((long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 2;
  local_308._1_1_ = _local_2f0 == 6;
  local_308._0_1_ = true;
  local_310 = (undefined1  [8])&PTR_streamReconstructedExpression_001db2b8;
  local_308._4_4_ = 6;
  local_300 = "==";
  local_2f8 = (undefined1  [8])0x2;
  Catch::AssertionHandler::handleExpr(&local_358,(ITransientExpression *)local_310);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_310);
  Catch::AssertionHandler::complete(&local_358);
  if (local_358.m_completed == false) {
    (*(local_358.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunkWithOneDilution( const section::Type< 2, 152 >& chunk ) {

  CHECK( 152 == chunk.MT() );
  CHECK( 152 == chunk.sectionNumber() );

  CHECK( 94239 == chunk.ZA() );
  CHECK( 94239 == chunk.targetIdentifier() );
  CHECK_THAT( 2.369986e+2, WithinRel( chunk.AWR() ) );
  CHECK_THAT( 2.369986e+2, WithinRel( chunk.atomicWeightRatio() ) );

  CHECK( 1 == chunk.LSSF() );
  CHECK( 1 == chunk.selfShieldingOnly() );
  CHECK( 2 == chunk.interpolation() );

  CHECK( 19 == chunk.NW() );
  CHECK( 19 == chunk.numberValues() );

  CHECK( 5 == chunk.NREAC() );
  CHECK( 5 == chunk.numberReactions() );
  CHECK( 1 == chunk.NSIGZ() );
  CHECK( 1 == chunk.numberDilutions() );
  CHECK( 3 == chunk.NUNR() );
  CHECK( 3 == chunk.numberEnergies() );

  CHECK_THAT( 0., WithinRel( chunk.TEMZ() ) );
  CHECK_THAT( 0., WithinRel( chunk.temperature() ) );

  CHECK( 1 == chunk.SIGZ().size() );
  CHECK( 1 == chunk.dilutions().size() );
  CHECK_THAT( 1e+10, WithinRel( chunk.SIGZ()[0] ) );
  CHECK_THAT( 1e+10, WithinRel( chunk.dilutions()[0] ) );

  CHECK( 3 == chunk.EUNR().size() );
  CHECK( 3 == chunk.energies().size() );
  CHECK_THAT( 2500., WithinRel( chunk.EUNR()[0] ) );
  CHECK_THAT( 2550., WithinRel( chunk.EUNR()[1] ) );
  CHECK_THAT( 30000., WithinRel( chunk.EUNR()[2] ) );
  CHECK_THAT( 2500., WithinRel( chunk.energies()[0] ) );
  CHECK_THAT( 2550., WithinRel( chunk.energies()[1] ) );
  CHECK_THAT( 30000., WithinRel( chunk.energies()[2] ) );

  CHECK( 3 == chunk.total().size() );
  CHECK( 3 == chunk.elastic().size() );
  CHECK( 3 == chunk.fission().size() );
  CHECK( 3 == chunk.capture().size() );
  CHECK( 3 == chunk.currentWeightedTotal().size() );
  CHECK( 1 == chunk.total()[0].size() );
  CHECK( 1 == chunk.elastic()[0].size() );
  CHECK( 1 == chunk.fission()[0].size() );
  CHECK( 1 == chunk.capture()[0].size() );
  CHECK( 1 == chunk.currentWeightedTotal()[0].size() );
  CHECK_THAT( 2.009120e+1, WithinRel( chunk.total()[0][0] ) );
  CHECK_THAT( 1.923568e+1, WithinRel( chunk.total()[1][0] ) );
  CHECK_THAT( 1.366039e+1, WithinRel( chunk.total()[2][0] ) );
  CHECK_THAT( 1.343187e+1, WithinRel( chunk.elastic()[0][0] ) );
  CHECK_THAT( 1.375705e+1, WithinRel( chunk.elastic()[1][0] ) );
  CHECK_THAT( 1.156033e+1, WithinRel( chunk.elastic()[2][0] ) );
  CHECK_THAT( 4.234708e+0, WithinRel( chunk.fission()[0][0] ) );
  CHECK_THAT( 2.725074e+0, WithinRel( chunk.fission()[1][0] ) );
  CHECK_THAT( 1.572008e+0, WithinRel( chunk.fission()[2][0] ) );
  CHECK_THAT( 2.424629e+0, WithinRel( chunk.capture()[0][0] ) );
  CHECK_THAT( 2.753559e+0, WithinRel( chunk.capture()[1][0] ) );
  CHECK_THAT( 5.280525e-1, WithinRel( chunk.capture()[2][0] ) );
  CHECK_THAT( 2.009120e+1, WithinRel( chunk.currentWeightedTotal()[0][0] ) );
  CHECK_THAT( 1.923568e+1, WithinRel( chunk.currentWeightedTotal()[1][0] ) );
  CHECK_THAT( 1.366039e+1, WithinRel( chunk.currentWeightedTotal()[2][0] ) );

  CHECK( 6 == chunk.NC() );
}